

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

guint8 h2b(char c)

{
  char c_local;
  guint8 local_1;
  
  switch(c) {
  case '0':
    local_1 = '\0';
    break;
  case '1':
    local_1 = '\x01';
    break;
  case '2':
    local_1 = '\x02';
    break;
  case '3':
    local_1 = '\x03';
    break;
  case '4':
    local_1 = '\x04';
    break;
  case '5':
    local_1 = '\x05';
    break;
  case '6':
    local_1 = '\x06';
    break;
  case '7':
    local_1 = '\a';
    break;
  case '8':
    local_1 = '\b';
    break;
  case '9':
    local_1 = '\t';
    break;
  default:
    local_1 = 0xff;
    break;
  case 'A':
  case 'a':
    local_1 = '\n';
    break;
  case 'B':
  case 'b':
    local_1 = '\v';
    break;
  case 'C':
  case 'c':
    local_1 = '\f';
    break;
  case 'D':
  case 'd':
    local_1 = '\r';
    break;
  case 'E':
  case 'e':
    local_1 = '\x0e';
    break;
  case 'F':
  case 'f':
    local_1 = '\x0f';
  }
  return local_1;
}

Assistant:

static inline guint8 h2b(char c) {
    switch (c) {
    case '0':
        return 0;
    case '1':
        return 1;
    case '2':
        return 2;
    case '3':
        return 3;
    case '4':
        return 4;
    case '5':
        return 5;
    case '6':
        return 6;
    case '7':
        return 7;
    case '8':
        return 8;
    case '9':
        return 9;
    case 'a':
    case 'A':
        return 10;
    case 'b':
    case 'B':
        return 11;
    case 'c':
    case 'C':
        return 12;
    case 'd':
    case 'D':
        return 13;
    case 'e':
    case 'E':
        return 14;
    case 'f':
    case 'F':
        return 15;
    }
    return 0xff;
}